

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O0

void __thiscall FIX::FieldMap::replaceGroup(FieldMap *this,int num,int tag,FieldMap *group)

{
  const_iterator rhs;
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  reference ppFVar4;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_50;
  __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
  local_48;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  local_28;
  const_iterator tagWithGroups;
  FieldMap *group_local;
  int tag_local;
  int num_local;
  FieldMap *this_local;
  
  tagWithGroups._M_node = (_Base_ptr)group;
  group_local._0_4_ = tag;
  group_local._4_4_ = num;
  _tag_local = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::find(&this->m_groups,(key_type *)&group_local);
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
       ::end(&this->m_groups);
  std::
  _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  bVar1 = std::operator==(&local_28,&local_38);
  if ((!bVar1) && (0 < (int)group_local._4_4_)) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
             ::operator->(&local_28);
    sVar3 = std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::size(&ppVar2->second);
    rhs = tagWithGroups;
    if (group_local._4_4_ <= sVar3) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>
               ::operator->(&local_28);
      local_50._M_current =
           (FieldMap **)
           std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::begin(&ppVar2->second);
      local_48 = __gnu_cxx::
                 __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                 ::operator+(&local_50,(long)(int)(group_local._4_4_ - 1));
      ppFVar4 = __gnu_cxx::
                __normal_iterator<FIX::FieldMap_*const_*,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>
                ::operator*(&local_48);
      operator=(*ppFVar4,(FieldMap *)rhs._M_node);
    }
  }
  return;
}

Assistant:

void FieldMap::replaceGroup(int num, int tag, const FieldMap &group) {
  Groups::const_iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }
  if (num <= 0) {
    return;
  }
  if (tagWithGroups->second.size() < static_cast<unsigned>(num)) {
    return;
  }
  *(*(tagWithGroups->second.begin() + (num - 1))) = group;
}